

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

void __thiscall QFactoryLoader::~QFactoryLoader(QFactoryLoader *this)

{
  QRecursiveMutex *pQVar1;
  bool bVar2;
  Private *pPVar3;
  qsizetype qVar4;
  const_reference pbVar5;
  QObject *pQVar6;
  iterator o;
  Private *in_RDI;
  long in_FS_OFFSET;
  QtPluginInstanceFunction staticInstance;
  QList<QObject_*(*)()> *__range1;
  value_type *plugin;
  qsizetype i;
  iterator __end1;
  iterator __begin1;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffff28;
  Private *in_stack_ffffffffffffff30;
  UnloadFlag flag;
  QLibraryPrivate *in_stack_ffffffffffffff88;
  long local_48;
  iterator local_28 [2];
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
          ::isDestroyed((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                         *)0x44324d);
  if (!bVar2) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>::
    operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                *)0x44326c);
    QMutexLocker<QRecursiveMutex>::QMutexLocker
              ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
    ;
    in_stack_ffffffffffffff88 =
         (QLibraryPrivate *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
         ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                       *)0x443291);
    QList<QFactoryLoader*>::removeOne<QFactoryLoader*>
              ((QList<QFactoryLoader_*> *)in_stack_ffffffffffffff30,
               (QFactoryLoader **)in_stack_ffffffffffffff28);
    QMutexLocker<QRecursiveMutex>::~QMutexLocker
              ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff30);
  }
  local_48 = 0;
  while( true ) {
    pPVar3 = Private::operator->(in_RDI);
    qVar4 = QList<bool>::size(&pPVar3->loadedLibraries);
    flag = (UnloadFlag)((ulong)pPVar3 >> 0x20);
    if (qVar4 <= local_48) break;
    Private::operator->(in_RDI);
    pbVar5 = QList<bool>::at((QList<bool> *)in_stack_ffffffffffffff30,
                             (qsizetype)in_stack_ffffffffffffff28);
    if ((*pbVar5 & 1U) != 0) {
      Private::operator->(in_RDI);
      std::
      vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
      ::at((vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
            *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>::operator->
                ((unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)0x4433a6);
      pQVar6 = QPointer<QObject>::data((QPointer<QObject> *)0x4433b2);
      if (pQVar6 != (QObject *)0x0) {
        (*pQVar6->_vptr_QObject[4])();
      }
      std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>::operator->
                ((unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)0x4433d5);
      QLibraryPrivate::unload(in_stack_ffffffffffffff88,flag);
    }
    local_48 = local_48 + 1;
  }
  Private::operator->(in_RDI);
  local_28[0].i = (_func_QObject_ptr **)&DAT_aaaaaaaaaaaaaaaa;
  local_28[0] = QList<QObject_*(*)()>::begin((QList<QObject_*(*)()> *)in_stack_ffffffffffffff30);
  o = QList<QObject_*(*)()>::end((QList<QObject_*(*)()> *)in_stack_ffffffffffffff30);
  while (bVar2 = QList<QObject_*(*)()>::iterator::operator!=(local_28,o), bVar2) {
    in_stack_ffffffffffffff30 = (Private *)QList<QObject_*(*)()>::iterator::operator*(local_28);
    pQVar1 = (QRecursiveMutex *)(in_stack_ffffffffffffff30->iid).d.d;
    if ((pQVar1 != (QRecursiveMutex *)0x0) &&
       (pQVar6 = (*(code *)pQVar1)(), pQVar6 != (QObject *)0x0)) {
      (*pQVar6->_vptr_QObject[4])();
    }
    QList<QObject_*(*)()>::iterator::operator++(local_28);
  }
  Private::~Private(in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QFactoryLoader::~QFactoryLoader()
{
    if (!qt_factoryloader_global.isDestroyed()) {
        QMutexLocker locker(&qt_factoryloader_global->mutex);
        qt_factoryloader_global->loaders.removeOne(this);
    }

#if QT_CONFIG(library)
    for (qsizetype i = 0; i < d->loadedLibraries.size(); ++i) {
        if (d->loadedLibraries.at(i)) {
            auto &plugin = d->libraries.at(i);
            delete plugin->inst.data();
            plugin->unload();
        }
    }
#endif

    for (QtPluginInstanceFunction staticInstance : d->usedStaticInstances) {
        if (staticInstance)
            delete staticInstance();
    }
}